

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O3

void readfile(char *data_file)

{
  vector<double,std::allocator<double>> *this;
  iterator __position;
  bool bVar1;
  pointer piVar2;
  int *piVar3;
  char *pcVar4;
  _Rb_tree_node_base *p_Var5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double now_data;
  vector<int,_std::allocator<int>_> all_label;
  set<int,_std::less<int>,_std::allocator<int>_> pool;
  char buff [200000];
  double dStack_30dd0;
  int *piStack_30dc8;
  iterator iStack_30dc0;
  int *piStack_30db8;
  FILE *pFStack_30db0;
  undefined1 auStack_30da8 [8];
  undefined8 uStack_30da0;
  _Base_ptr p_Stack_30d98;
  _Rb_tree_node_base *p_Stack_30d90;
  _Rb_tree_node_base *p_Stack_30d88;
  size_t sStack_30d80;
  char acStack_30d78 [200008];
  
  pFStack_30db0 = fopen(data_file,"r");
  iVar7 = 0;
  bVar1 = false;
  if (0 < data_n) {
    do {
      auStack_30da8 = (undefined1  [8])0x0;
      uStack_30da0 = (pointer)0x0;
      p_Stack_30d98 = (_Base_ptr)0x0;
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)&data_x,(vector<double,_std::allocator<double>_> *)auStack_30da8);
      if (auStack_30da8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_30da8);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < data_n);
    bVar1 = 0 < data_n;
  }
  p_Stack_30d90 = (_Rb_tree_node_base *)&uStack_30da0;
  uStack_30da0 = (pointer)((ulong)uStack_30da0._4_4_ << 0x20);
  p_Stack_30d98 = (_Base_ptr)0x0;
  sStack_30d80 = 0;
  piStack_30db8 = (int *)0x0;
  piStack_30dc8 = (int *)0x0;
  iStack_30dc0._M_current = (int *)0x0;
  p_Stack_30d88 = p_Stack_30d90;
  if (bVar1) {
    lVar8 = 0;
    do {
      fgets(acStack_30d78,200000,pFStack_30db0);
      pcVar4 = strtok(acStack_30d78,", \r\n");
      iVar7 = atoi(pcVar4);
      if (label.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          label.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        dStack_30dd0._0_4_ = iVar7;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&label,(iterator)
                          label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish,(int *)&dStack_30dd0);
      }
      else {
        *label.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar7;
        label.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      dStack_30dd0 = (double)CONCAT44(dStack_30dd0._4_4_,iVar7);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 auStack_30da8,(int *)&dStack_30dd0);
      pcVar4 = strtok((char *)0x0,", \r\n");
      if (0 < ts_len) {
        iVar7 = 0;
        do {
          dStack_30dd0 = atof(pcVar4);
          dVar12 = dStack_30dd0;
          if (dStack_30dd0 <= max_data) {
            dVar12 = max_data;
          }
          dVar13 = dStack_30dd0;
          if (min_data <= dStack_30dd0) {
            dVar13 = min_data;
          }
          this = (vector<double,std::allocator<double>> *)
                 (data_x.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar8);
          __position._M_current = *(double **)(this + 8);
          max_data = dVar12;
          min_data = dVar13;
          if (__position._M_current == *(double **)(this + 0x10)) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (this,__position,&dStack_30dd0);
          }
          else {
            *__position._M_current = dStack_30dd0;
            *(double **)(this + 8) = __position._M_current + 1;
          }
          pcVar4 = strtok((char *)0x0,", \r\n");
          iVar7 = iVar7 + 1;
        } while (iVar7 < ts_len);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < data_n);
    num_c = (int)sStack_30d80;
    if (p_Stack_30d90 != (_Rb_tree_node_base *)&uStack_30da0) {
      p_Var5 = p_Stack_30d90;
      do {
        if (iStack_30dc0._M_current == piStack_30db8) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&piStack_30dc8,iStack_30dc0,
                     (int *)(p_Var5 + 1));
        }
        else {
          *iStack_30dc0._M_current = p_Var5[1]._M_color;
          iStack_30dc0._M_current = iStack_30dc0._M_current + 1;
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != (_Rb_tree_node_base *)&uStack_30da0);
    }
    piVar2 = label.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (0 < data_n) {
      uVar6 = (long)iStack_30dc0._M_current - (long)piStack_30dc8 >> 2;
      lVar8 = 0;
      do {
        piVar10 = piStack_30dc8;
        if (0 < (long)uVar6) {
          uVar9 = uVar6;
          do {
            uVar11 = uVar9 >> 1;
            uVar9 = ~uVar11 + uVar9;
            piVar3 = piVar10 + uVar11 + 1;
            if (piVar2[lVar8] <= piVar10[uVar11]) {
              uVar9 = uVar11;
              piVar3 = piVar10;
            }
            piVar10 = piVar3;
          } while (0 < (long)uVar9);
        }
        iVar7 = (int)((ulong)((long)piVar10 - (long)piStack_30dc8) >> 2);
        piVar2[lVar8] = iVar7;
        datacnt[iVar7] = datacnt[iVar7] + 1;
        lVar8 = lVar8 + 1;
      } while (lVar8 < data_n);
    }
  }
  else {
    num_c = 0;
  }
  max_data = ((max_data - min_data) / 10.0) / 100.0 + max_data;
  bucket_w = (max_data - min_data) / 10.0;
  fclose(pFStack_30db0);
  if (piStack_30dc8 != (int *)0x0) {
    operator_delete(piStack_30dc8);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             auStack_30da8);
  return;
}

Assistant:

void readfile(char *data_file) {
    FILE *f;
    f = fopen(data_file, "r");

    char buff[MAX_CHAR_PER_LINE];
    char *tmp;

    for (int i = 0; i < data_n; ++i) {
        data_x.push_back(vector<double>());
    }

    set<int> pool;
    vector<int> all_label;

    for (int i = 0; i < data_n; i++) {
        fgets(buff, MAX_CHAR_PER_LINE, f);
        tmp = strtok(buff, ", \r\n");

        double now_label = atoi(tmp);
        label.push_back(now_label);
        pool.insert(now_label);

        tmp = strtok(NULL, ", \r\n");
        for (int j = 0; j < ts_len; ++j) {

            double now_data = atof(tmp);
            max_data = max(max_data, now_data);
            min_data = min(min_data, now_data);

            data_x[i].push_back(now_data);
            tmp = strtok(NULL, ", \r\n");
        }
    }

    num_c = pool.size();
//    for (int item : pool) {
//        all_label.push_back(item);
//    }
    for (set<int>::iterator it = pool.begin(); it != pool.end(); ++it) {
        all_label.push_back(*it);
    }

    for (int i = 0; i < data_n; ++i) {
        label[i] = lower_bound(all_label.begin(), all_label.end(), label[i]) - all_label.begin();
        ++datacnt[label[i]];
    }

    bucket_w = (max_data - min_data) / PAA_BUCKET;
    max_data += bucket_w / 100;
    bucket_w = (max_data - min_data) / PAA_BUCKET;

    fclose(f);
}